

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
pdqsort_detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_24_3_1824b316 comp)

{
  unsigned_long uVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b_01;
  uchar uVar2;
  char cVar3;
  bool bVar4;
  reference piVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var6;
  ulong uVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  unsigned_long *puVar8;
  int *in_RSI;
  int *in_RDI;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  size_t num;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t right_split;
  size_t left_split;
  size_t num_unknown;
  size_t start_r;
  size_t start_l;
  size_t num_r;
  size_t num_l;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> offsets_r_base;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> offsets_l_base;
  uchar *offsets_r;
  uchar *offsets_l;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  T pivot;
  undefined4 in_stack_fffffffffffffda8;
  int iVar10;
  undefined4 in_stack_fffffffffffffdac;
  int iVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffdb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffdb8;
  ulong local_240;
  ulong local_238;
  byte local_229;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffdf0;
  anon_class_24_3_1824b316 *in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  uchar *in_stack_fffffffffffffe08;
  uchar *in_stack_fffffffffffffe10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  long local_198;
  long local_190;
  unsigned_long local_188;
  unsigned_long local_180;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_178;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_170;
  uchar *local_168;
  uchar *local_160;
  uchar local_158 [128];
  uchar local_d8 [128];
  int *local_58;
  int *local_50;
  undefined1 local_41;
  int *local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int local_24;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18 [3];
  
  local_20 = in_RSI;
  local_18[0]._M_current = in_RDI;
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  local_24 = *piVar5;
  local_30._M_current = local_18[0]._M_current;
  local_38._M_current = local_20;
  do {
    p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++(&local_30);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*(p_Var6);
    bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                      (in_stack_fffffffffffffdf8,
                       (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                       (HighsInt)in_stack_fffffffffffffdf0._M_current);
  } while (bVar4);
  local_40 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator-(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0._M_current);
  bVar4 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffdb0._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  if (bVar4) {
    do {
      bVar4 = __gnu_cxx::operator<
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffdb0._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      local_229 = 0;
      if (bVar4) {
        p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_38);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (p_Var6);
        bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          (in_stack_fffffffffffffdf8,
                           (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                           (HighsInt)in_stack_fffffffffffffdf0._M_current);
        local_229 = bVar4 ^ 0xff;
      }
    } while ((local_229 & 1) != 0);
  }
  else {
    do {
      p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_38);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (p_Var6);
      bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                        (in_stack_fffffffffffffdf8,
                         (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                         (HighsInt)in_stack_fffffffffffffdf0._M_current);
    } while (((bVar4 ^ 0xffU) & 1) != 0);
  }
  local_41 = __gnu_cxx::operator>=
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_fffffffffffffdb0._M_current,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  if (!(bool)local_41) {
    local_50 = local_30._M_current;
    local_58 = local_38._M_current;
    __b._M_current._4_4_ = in_stack_fffffffffffffdac;
    __b._M_current._0_4_ = in_stack_fffffffffffffda8;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (in_stack_fffffffffffffdb0,__b);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
    local_160 = align_cacheline<unsigned_char>(local_d8);
    local_168 = align_cacheline<unsigned_char>(local_158);
    local_170._M_current = local_30._M_current;
    local_178._M_current = local_38._M_current;
    local_198 = 0;
    local_190 = 0;
    local_188 = 0;
    local_180 = 0;
    while (bVar4 = __gnu_cxx::operator<
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffdb0._M_current,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)), bVar4)
    {
      uVar7 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffdb0._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      if (local_180 == 0) {
        local_238 = uVar7;
        if (local_188 == 0) {
          local_238 = uVar7 >> 1;
        }
        local_240 = local_238;
      }
      else {
        local_240 = 0;
      }
      if (local_188 == 0) {
        p_Var6 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 (uVar7 - local_240);
      }
      else {
        p_Var6 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)0x0;
      }
      in_stack_fffffffffffffdb8 = p_Var6;
      if (local_240 < 0x40) {
        local_1c0 = 0;
        while (local_1c0 < local_240) {
          local_160[local_180] = (uchar)local_1c0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
          local_1c0 = local_1c0 + 1;
        }
      }
      else {
        local_1b8 = 0;
        while (local_1b8 < 0x40) {
          uVar2 = (uchar)local_1b8;
          local_160[local_180] = uVar2;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
          local_160[local_180] = uVar2 + '\x01';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
          local_160[local_180] = uVar2 + '\x02';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
          local_160[local_180] = uVar2 + '\x03';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
          local_160[local_180] = uVar2 + '\x04';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
          local_160[local_180] = uVar2 + '\x05';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
          local_160[local_180] = uVar2 + '\x06';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
          local_1b8 = local_1b8 + 8;
          local_160[local_180] = uVar2 + '\a';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_30);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_180 = ((bVar4 ^ 0xffU) & 1) + local_180;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_30);
        }
      }
      if (p_Var6 < (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)0x40) {
        local_1d0 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)0x0;
        while (local_1d0 < p_Var6) {
          local_1d0 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      ((long)&local_1d0->_M_current + 1);
          local_168[local_188] = (uchar)local_1d0;
          this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (this);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
        }
      }
      else {
        local_1c8 = 0;
        while (local_1c8 < 0x40) {
          cVar3 = (char)local_1c8;
          local_168[local_188] = cVar3 + '\x01';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
          local_168[local_188] = cVar3 + '\x02';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
          local_168[local_188] = cVar3 + '\x03';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
          local_168[local_188] = cVar3 + '\x04';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
          local_168[local_188] = cVar3 + '\x05';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
          local_168[local_188] = cVar3 + '\x06';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
          local_168[local_188] = cVar3 + '\a';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
          local_1c8 = local_1c8 + 8;
          local_168[local_188] = (uchar)local_1c8;
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (in_stack_fffffffffffffdf8,
                             (HighsInt)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20),
                             (HighsInt)in_stack_fffffffffffffdf0._M_current);
          local_188 = bVar4 + local_188;
        }
      }
      puVar8 = std::min<unsigned_long>(&local_180,&local_188);
      uVar1 = *puVar8;
      swap_offsets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_170,local_178,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
      local_180 = local_180 - uVar1;
      local_188 = local_188 - uVar1;
      local_190 = uVar1 + local_190;
      local_198 = uVar1 + local_198;
      if (local_180 == 0) {
        local_190 = 0;
        local_170._M_current = local_30._M_current;
      }
      if (local_188 == 0) {
        local_198 = 0;
        local_178._M_current = local_38._M_current;
      }
    }
    if (local_180 != 0) {
      local_160 = local_160 + local_190;
      while (local_180 != 0) {
        local_180 = local_180 - 1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator--
                  (&local_38);
        __b_00._M_current._4_4_ = in_stack_fffffffffffffdac;
        __b_00._M_current._0_4_ = in_stack_fffffffffffffda8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (in_stack_fffffffffffffdb0,__b_00);
      }
      local_30._M_current = local_38._M_current;
      local_180 = local_180 - 1;
    }
    if (local_188 != 0) {
      local_168 = local_168 + local_198;
      while (local_188 != 0) {
        local_188 = local_188 - 1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0._M_current);
        __b_01._M_current._4_4_ = in_stack_fffffffffffffdac;
        __b_01._M_current._0_4_ = in_stack_fffffffffffffda8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (in_stack_fffffffffffffdb0,__b_01);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_30);
      }
      local_38._M_current = local_30._M_current;
      local_188 = local_188 - 1;
    }
  }
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
            (in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0._M_current);
  p_Var6 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
           &stack0xfffffffffffffdf0;
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var6);
  iVar10 = *piVar5;
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  *piVar5 = iVar10;
  iVar11 = local_24;
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var6);
  *piVar5 = iVar11;
  pVar9 = std::
          make_pair<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>&,bool&>
                    (p_Var6,(bool *)CONCAT44(iVar11,iVar10));
  return pVar9;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }